

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

_Bool upb_Message_NextUnknown(upb_Message *msg,upb_StringView *data,uintptr_t *iter)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  _Bool _Var4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = *iter;
  puVar5 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
  if (puVar5 == (uint *)0x0) {
LAB_002bc65d:
    data->data = (char *)0x0;
    data->size = 0;
    _Var4 = false;
  }
  else {
    uVar8 = (ulong)*puVar5;
    uVar6 = uVar7;
    uVar3 = uVar8;
    if (uVar8 < uVar7) {
      uVar3 = uVar7;
    }
    do {
      uVar7 = uVar3;
      if (uVar8 <= uVar6) goto LAB_002bc65d;
      uVar1 = *(ulong *)(puVar5 + uVar6 * 2 + 2);
      uVar6 = uVar6 + 1;
      uVar3 = uVar7;
    } while ((uVar1 & 1) != 0 || uVar1 == 0);
    sVar2 = ((undefined8 *)(uVar1 & 0xfffffffffffffffc))[1];
    data->data = *(char **)(uVar1 & 0xfffffffffffffffc);
    data->size = sVar2;
    _Var4 = true;
    uVar7 = uVar6;
  }
  *iter = uVar7;
  return _Var4;
}

Assistant:

UPB_INLINE bool upb_Message_NextUnknown(const struct upb_Message* msg,
                                        upb_StringView* data, uintptr_t* iter) {
  const upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  size_t i = *iter;
  if (in) {
    while (i < in->size) {
      upb_TaggedAuxPtr tagged_ptr = in->aux_data[i++];
      if (upb_TaggedAuxPtr_IsUnknown(tagged_ptr)) {
        *data = *upb_TaggedAuxPtr_UnknownData(tagged_ptr);
        *iter = i;
        return true;
      }
    }
  }
  data->size = 0;
  data->data = NULL;
  *iter = i;
  return false;
}